

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

int __thiscall ON_PolyCurve::SpanCount(ON_PolyCurve *this)

{
  uint uVar1;
  ON_Curve *pOVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar7 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  iVar5 = 0;
  while (((iVar4 = iVar5, uVar6 != uVar7 &&
          (pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar7], iVar4 = 0,
          pOVar2 != (ON_Curve *)0x0)) &&
         (iVar3 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(), iVar3 != 0
         ))) {
    iVar5 = iVar5 + iVar3;
    uVar7 = uVar7 + 1;
  }
  return iVar4;
}

Assistant:

int ON_PolyCurve::SpanCount() const
{
  int span_count = 0;
  const int segment_count = Count();
  int i, j;
  for ( i = 0; i < segment_count; i++  ) {
    if ( !m_segment[i] )
      return false;
    j = m_segment[i]->SpanCount();
    if ( j == 0 )
      return 0;
    span_count += j;
  }
  return span_count;
}